

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
          (RepeatedEnumFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  Options *options_local;
  FieldDescriptor *descriptor_local;
  RepeatedEnumFieldGenerator *this_local;
  
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,descriptor,options);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedEnumFieldGenerator_008e93c0;
  anon_unknown_4::SetEnumVariables(descriptor,&(this->super_FieldGenerator).variables_,options);
  return;
}

Assistant:

RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : FieldGenerator(descriptor, options) {
  SetEnumVariables(descriptor, &variables_, options);
}